

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdump::BeginGlobal
          (BinaryReaderObjdump *this,Index index,Type type,bool mutable_)

{
  undefined7 in_register_00000009;
  string_view sVar1;
  Type local_48;
  string local_40;
  
  local_48 = type;
  Type::GetName_abi_cxx11_(&local_40,&local_48);
  PrintDetails(this," - global[%u] %s mutable=%d",(ulong)index,local_40._M_dataplus._M_p,
               CONCAT71(in_register_00000009,mutable_) & 0xffffffff);
  std::__cxx11::string::_M_dispose();
  sVar1 = BinaryReaderObjdumpBase::GetGlobalName(&this->super_BinaryReaderObjdumpBase,index);
  if (sVar1._M_len != 0) {
    PrintDetails(this," <%.*s>",(ulong)(uint)sVar1._M_len,sVar1._M_str);
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::BeginGlobal(Index index, Type type, bool mutable_) {
  PrintDetails(" - global[%" PRIindex "] %s mutable=%d", index,
               type.GetName().c_str(), mutable_);
  std::string_view name = GetGlobalName(index);
  if (!name.empty()) {
    PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  return Result::Ok;
}